

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeadNode.h
# Opt level: O3

void __thiscall
duckdb_skiplistlib::skip_list::
HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
::insert(HeadNode<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
         *this,pair<unsigned_long,_duckdb::interval_t> *value)

{
  SwappableNodeRefStack<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *this_00;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *pNVar1;
  size_t sVar2;
  size_t sVar3;
  Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
  *pNVar4;
  pointer pNVar5;
  size_t *psVar6;
  pointer pNVar7;
  pointer pNVar8;
  long lVar9;
  ulong uVar10;
  pointer pNVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  bool bVar15;
  
  lVar9 = (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)(this->_nodeRefs)._nodes.
                super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
  this_00 = &this->_nodeRefs;
  uVar14 = lVar9 >> 4;
  do {
    bVar15 = uVar14 == 0;
    uVar14 = uVar14 - 1;
    if (bVar15) {
      pNVar4 = Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
               ::_Pool::Allocate(&this->_pool,value);
      uVar14 = 0;
      break;
    }
    pNVar4 = Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
             ::insert(*(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                        **)((long)&(this_00->_nodes).
                                   super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start[-1].pNode + lVar9),
                      value);
    lVar9 = lVar9 + -0x10;
  } while (pNVar4 == (Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                      *)0x0);
  uVar10 = (pNVar4->_nodeRefs)._swapLevel;
  pNVar5 = (pNVar4->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar8 = (pNVar4->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pNVar7 = (this->_nodeRefs)._nodes.
           super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pNVar11 = (this->_nodeRefs)._nodes.
            super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (uVar10 < (ulong)((long)pNVar8 - (long)pNVar5 >> 4)) {
    if ((ulong)((long)pNVar11 - (long)pNVar7) < (ulong)((long)pNVar8 - (long)pNVar5)) {
      do {
        SwappableNodeRefStack<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
        ::push_back(this_00,(Node<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>
                             *)0x0,this->_count + 1);
        pNVar7 = (this->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar11 = (this->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        pNVar5 = (pNVar4->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar8 = (pNVar4->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      } while ((ulong)((long)pNVar11 - (long)pNVar7) < (ulong)((long)pNVar8 - (long)pNVar5));
      uVar10 = (pNVar4->_nodeRefs)._swapLevel;
    }
    if (uVar14 < uVar10) {
      pNVar5[uVar10].width = pNVar5[uVar10].width + pNVar7[uVar14].width;
      uVar14 = uVar14 + 1;
    }
    if ((uVar14 < (ulong)((long)pNVar11 - (long)pNVar7 >> 4)) &&
       (uVar10 < (ulong)((long)pNVar8 - (long)pNVar5 >> 4))) {
      uVar12 = uVar14 << 4 | 8;
      do {
        uVar14 = uVar14 + 1;
        *(long *)((long)&pNVar7->pNode + uVar12) =
             (*(long *)((long)&pNVar7->pNode + uVar12) - *(long *)((long)&pNVar5->pNode + uVar12)) +
             1;
        pNVar1 = pNVar7[uVar10].pNode;
        sVar2 = pNVar7[uVar10].width;
        sVar3 = pNVar5[uVar10].width;
        pNVar7[uVar10].pNode = pNVar5[uVar10].pNode;
        pNVar7[uVar10].width = sVar3;
        pNVar5 = (pNVar4->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start + (pNVar4->_nodeRefs)._swapLevel;
        pNVar5->pNode = pNVar1;
        pNVar5->width = sVar2;
        uVar10 = (pNVar4->_nodeRefs)._swapLevel + 1;
        (pNVar4->_nodeRefs)._swapLevel = uVar10;
        pNVar5 = (pNVar4->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pNVar8 = (pNVar4->_nodeRefs)._nodes.
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        uVar13 = (long)pNVar8 - (long)pNVar5 >> 4;
        pNVar7 = (this_00->_nodes).
                 super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (uVar10 < uVar13) {
          pNVar5[uVar10].width = *(size_t *)((long)&pNVar7->pNode + uVar12);
        }
        pNVar11 = (this->_nodeRefs)._nodes.
                  super__Vector_base<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>,_std::allocator<duckdb_skiplistlib::skip_list::NodeRef<std::pair<unsigned_long,_duckdb::interval_t>,_duckdb::SkipLess<std::pair<unsigned_long,_duckdb::interval_t>_>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
      } while ((uVar14 < (ulong)((long)pNVar11 - (long)pNVar7 >> 4)) &&
              (uVar12 = uVar12 + 0x10, uVar10 < uVar13));
    }
  }
  uVar14 = uVar14 + (uVar14 < uVar10);
  uVar10 = (long)pNVar11 - (long)pNVar7 >> 4;
  if (uVar14 < uVar10) {
    psVar6 = &pNVar7[uVar14].width;
    uVar12 = uVar14;
    do {
      if (uVar14 < (ulong)((long)pNVar8 - (long)pNVar5 >> 4)) break;
      *psVar6 = *psVar6 + 1;
      uVar12 = uVar12 + 1;
      psVar6 = psVar6 + 2;
    } while (uVar12 < uVar10);
  }
  this->_count = this->_count + 1;
  return;
}

Assistant:

void HeadNode<T, _Compare>::insert(const T &value) {
#ifdef SKIPLIST_THREAD_SUPPORT
    std::lock_guard<std::mutex> lock(gSkipListMutex);
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode insert() thread: " << std::this_thread::get_id() << std::endl;
#endif
#endif
    Node<T, _Compare> *pNode = nullptr;
    size_t level = _nodeRefs.height();

    _throwIfValueDoesNotCompare(value);
    while (level-- > 0) {
        assert(_nodeRefs[level].pNode);
        pNode = _nodeRefs[level].pNode->insert(value);
        if (pNode) {
            break;
        }
    }
    if (! pNode) {
        pNode = _pool.Allocate(value);
        level = 0;
    }
    assert(pNode);
    SwappableNodeRefStack<T, _Compare> &thatRefs = pNode->nodeRefs();
    if (thatRefs.canSwap()) {
        // Expand this to that
        while (_nodeRefs.height() < thatRefs.height()) {
            _nodeRefs.push_back(nullptr, _count + 1);
        }
        if (level < thatRefs.swapLevel()) {
            // Happens when we were originally, say 3 high (max height of any
            // previously seen node). Then a node is created
            // say 5 high. In that case this will be at level 2 and
            // thatRefs.swapLevel() will be 3
            assert(level + 1 == thatRefs.swapLevel());
            thatRefs[thatRefs.swapLevel()].width += _nodeRefs[level].width;
            ++level;
        }
        // Now swap
        while (level < _nodeRefs.height() && thatRefs.canSwap()) {
            assert(thatRefs.canSwap());
            assert(level == thatRefs.swapLevel());
            _nodeRefs[level].width -= thatRefs[level].width - 1;
            thatRefs.swap(_nodeRefs);
            if (thatRefs.canSwap()) {
                assert(thatRefs[thatRefs.swapLevel()].width == 0);
                thatRefs[thatRefs.swapLevel()].width = _nodeRefs[level].width;
            }
            ++level;
        }
        // Check all references swapped
        assert(! thatRefs.canSwap());
        // Check that all 'this' pointers created on construction have been moved
        assert(thatRefs.noNodePointerMatches(pNode));
    }
    if (level < thatRefs.swapLevel()) {
        // Happens when we are, say 5 high then a node is created
        // and consumed by the next node say 3 high. In that case this will be
        // at level 2 and thatRefs.swapLevel() will be 3
        assert(level + 1 == thatRefs.swapLevel());
        ++level;
    }
    // Increment my widths as my references are now going over the top of
    // pNode.
    while (level < _nodeRefs.height() && level >= thatRefs.height()) {
        _nodeRefs[level++].width += 1;
    }
    ++_count;
#ifdef SKIPLIST_THREAD_SUPPORT
#ifdef SKIPLIST_THREAD_SUPPORT_TRACE
    std::cout << "HeadNode insert() thread: " << std::this_thread::get_id() << " DONE" << std::endl;
#endif
#endif
}